

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

bool transform_rellocs(vector<char,_std::allocator<char>_> *raw,
                      vector<explode::rellocation,_std::allocator<explode::rellocation>_> *out)

{
  pointer pcVar1;
  pointer pcVar2;
  ulong uVar3;
  long lVar4;
  rellocation local_34;
  
  pcVar1 = (raw->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar2 = (raw->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar3 = (long)pcVar2 - (long)pcVar1;
  if ((uVar3 & 3) == 0) {
    if (pcVar2 != pcVar1) {
      lVar4 = 0;
      do {
        local_34 = *(rellocation *)
                    ((raw->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar4 * 4);
        std::vector<explode::rellocation,_std::allocator<explode::rellocation>_>::
        emplace_back<explode::rellocation>(out,&local_34);
        lVar4 = lVar4 + 1;
      } while ((uVar3 >> 2) + (ulong)(uVar3 >> 2 == 0) != lVar4);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"rellocations area size should be divisible by 4",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  return (uVar3 & 3) == 0;
}

Assistant:

static bool transform_rellocs(const std::vector <char> raw, std::vector <explode::rellocation>& out)
{
	const std::size_t sz = raw.size();
	if (sz % 4)
	{
		std::cout << "rellocations area size should be divisible by 4" << std::endl;
		return false;
	}
	for (std::size_t i = 0; i < sz / 4; i++)
	{
		const char* rel_b = &raw[4 * i];
		const char* seg_b = &raw[4 * i + 2];
		union
		{
			const uint16_t* words;
			const char*     bytes;
		} u;
		u.bytes = rel_b;
		uint16_t rel = *u.words;
		u.bytes = seg_b;
		uint16_t seg = *u.words;
		out.push_back(explode::rellocation(seg, rel));
	}
	return true;
}